

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

bool __thiscall olc::ResourcePack::AddFile(ResourcePack *this,string *sFile)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  path local_60;
  string file;
  
  makeposix(&file,(ResourcePack *)sFile,sFile);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,&file,auto_format);
  bVar1 = std::filesystem::exists(&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_60,&file,auto_format);
    uVar2 = std::filesystem::file_size(&local_60);
    std::filesystem::__cxx11::path::~path(&local_60);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::operator[](&this->mapFiles,&file);
    pmVar3->nSize = uVar2;
    pmVar3->nOffset = 0;
  }
  std::__cxx11::string::~string((string *)&file);
  return bVar1;
}

Assistant:

bool ResourcePack::AddFile(const std::string &sFile)
	{
		const std::string file = makeposix(sFile);

		if (_gfs::exists(file))
		{
			sResourceFile e;
			e.nSize = (uint32_t)_gfs::file_size(file);
			e.nOffset = 0; // Unknown at this stage
			mapFiles[file] = e;
			return true;
		}
		return false;
	}